

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20240722::debugging_internal::ParseUnqualifiedName(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bool bVar10;
  int iVar11;
  ComplexityGuard guard;
  bool bVar12;
  char *pcVar13;
  ParseState copy;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  iVar11 = iVar2 + 1;
  state->recursion_depth = iVar11;
  state->steps = iVar3 + 1;
  if (0x1ffff < iVar3 || 0xff < iVar2) {
    bVar12 = false;
    goto LAB_00105ebb;
  }
  bVar10 = ParseOperatorName(state,(int *)0x0);
  if (!bVar10) {
    iVar11 = state->recursion_depth;
    iVar2 = state->steps;
    state->recursion_depth = iVar11 + 1;
    state->steps = iVar2 + 1;
    if (iVar2 < 0x20000 && iVar11 < 0x100) {
      uVar4 = (state->parse_state).mangled_idx;
      uVar5 = (state->parse_state).out_cur_idx;
      uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
      bVar10 = ParseOneCharToken(state,'C');
      if (!bVar10) goto LAB_00105d99;
      bVar10 = ParseCharClass(state,"1234");
      if (bVar10) {
        pcVar13 = state->out;
        iVar11 = (state->parse_state).prev_name_idx;
LAB_00105ddd:
        MaybeAppendWithLength
                  (state,pcVar13 + iVar11,(ulong)*(ushort *)&(state->parse_state).field_0xc);
      }
      else {
        bVar10 = ParseOneCharToken(state,'I');
        if (!bVar10) {
LAB_00105d99:
          pPVar1 = &state->parse_state;
          pPVar1->mangled_idx = uVar4;
          pPVar1->out_cur_idx = uVar5;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
          bVar10 = ParseOneCharToken(state,'D');
          if (bVar10) {
            bVar10 = ParseCharClass(state,"0124");
            if (bVar10) {
              pcVar13 = state->out;
              iVar11 = (state->parse_state).prev_name_idx;
              MaybeAppend(state,"~");
              goto LAB_00105ddd;
            }
          }
          pPVar1->mangled_idx = uVar4;
          pPVar1->out_cur_idx = uVar5;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
          iVar11 = state->recursion_depth + -1;
          goto LAB_00105e01;
        }
        bVar10 = ParseCharClass(state,"12");
        if (!bVar10) goto LAB_00105d99;
        bVar10 = ParseClassEnumType(state);
        if (!bVar10) goto LAB_00105d99;
      }
      state->recursion_depth = state->recursion_depth + -1;
    }
    else {
LAB_00105e01:
      state->recursion_depth = iVar11;
      bVar10 = ParseSourceName(state);
      if (!bVar10) {
        bVar10 = ParseLocalSourceName(state);
        if (!bVar10) {
          bVar10 = ParseUnnamedTypeName(state);
          if (!bVar10) {
            uVar7 = (state->parse_state).mangled_idx;
            uVar8 = (state->parse_state).out_cur_idx;
            uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
            bVar10 = ParseTwoCharToken(state,"DC");
            if (bVar10) {
              bVar10 = OneOrMore(ParseSourceName,state);
              if (!bVar10) goto LAB_00105f0f;
              bVar10 = ParseOneCharToken(state,'E');
              bVar12 = true;
              if (!bVar10) goto LAB_00105f0f;
            }
            else {
LAB_00105f0f:
              pPVar1 = &state->parse_state;
              pPVar1->mangled_idx = uVar7;
              pPVar1->out_cur_idx = uVar8;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
              bVar10 = ParseOneCharToken(state,'F');
              if (bVar10) {
                MaybeAppend(state,"friend ");
                bVar10 = ParseSourceName(state);
                bVar12 = true;
                if (!bVar10) {
                  bVar10 = ParseOperatorName(state,(int *)0x0);
                  if (!bVar10) goto LAB_00105f56;
                }
              }
              else {
LAB_00105f56:
                pPVar1->mangled_idx = uVar7;
                pPVar1->out_cur_idx = uVar8;
                *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
                bVar12 = false;
              }
            }
            iVar11 = state->recursion_depth;
            goto LAB_00105ebb;
          }
        }
      }
    }
  }
  iVar11 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar11 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar11 < 0x100) {
    pPVar1 = &state->parse_state;
    while( true ) {
      bVar10 = ParseOneCharToken(state,'B');
      if (!bVar10) break;
      iVar11 = pPVar1->mangled_idx;
      iVar2 = pPVar1->out_cur_idx;
      iVar3 = (state->parse_state).prev_name_idx;
      uVar9 = *(undefined4 *)&(state->parse_state).field_0xc;
      MaybeAppend(state,"[abi:");
      bVar10 = ParseSourceName(state);
      if (!bVar10) {
        pPVar1->mangled_idx = iVar11;
        pPVar1->out_cur_idx = iVar2;
        (state->parse_state).prev_name_idx = iVar3;
        *(undefined4 *)&(state->parse_state).field_0xc = uVar9;
        goto LAB_00105eb1;
      }
      MaybeAppend(state,"]");
    }
    bVar12 = true;
  }
  else {
LAB_00105eb1:
    bVar12 = false;
  }
  iVar11 = state->recursion_depth + -1;
  state->recursion_depth = iVar11;
LAB_00105ebb:
  state->recursion_depth = iVar11 + -1;
  return bVar12;
}

Assistant:

static bool ParseUnqualifiedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseOperatorName(state, nullptr) || ParseCtorDtorName(state) ||
      ParseSourceName(state) || ParseLocalSourceName(state) ||
      ParseUnnamedTypeName(state)) {
    return ParseAbiTags(state);
  }

  // DC <source-name>+ E
  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "DC") && OneOrMore(ParseSourceName, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // F <source-name>
  // F <operator-name>
  if (ParseOneCharToken(state, 'F') && MaybeAppend(state, "friend ") &&
      (ParseSourceName(state) || ParseOperatorName(state, nullptr))) {
    return true;
  }
  state->parse_state = copy;

  return false;
}